

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O2

void __thiscall
deqp::gls::BuiltinPrecisionTests::VariableStatement<tcu::Matrix<float,_4,_2>_>::VariableStatement
          (VariableStatement<tcu::Matrix<float,_4,_2>_> *this,
          VariableP<tcu::Matrix<float,_4,_2>_> *variable,ExprP<tcu::Matrix<float,_4,_2>_> *value,
          bool isDeclaration)

{
  (this->super_Statement)._vptr_Statement = (_func_int **)&PTR__VariableStatement_00a23e90;
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>::
  SharedPtr(&(this->m_variable).
             super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
            ,&variable->
              super_SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Variable<tcu::Matrix<float,_4,_2>_>_>
           );
  de::SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_2>_>_>::SharedPtr
            ((SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_2>_>_> *)
             &this->m_value,
             (SharedPtr<const_deqp::gls::BuiltinPrecisionTests::Expr<tcu::Matrix<float,_4,_2>_>_> *)
             value);
  this->m_isDeclaration = isDeclaration;
  return;
}

Assistant:

VariableStatement	(const VariableP<T>& variable, const ExprP<T>& value,
										 bool isDeclaration)
						: m_variable		(variable)
						, m_value			(value)
						, m_isDeclaration	(isDeclaration) {}